

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void cmScriptGeneratorEncodeConfig(string *config,string *result)

{
  char *local_20;
  char *c;
  string *result_local;
  string *config_local;
  
  for (local_20 = (char *)std::__cxx11::string::c_str(); *local_20 != '\0'; local_20 = local_20 + 1)
  {
    if ((*local_20 < 'a') || ('z' < *local_20)) {
      if ((*local_20 < 'A') || ('Z' < *local_20)) {
        std::__cxx11::string::operator+=((string *)result,*local_20);
      }
      else {
        std::__cxx11::string::operator+=((string *)result,"[");
        std::__cxx11::string::operator+=((string *)result,*local_20);
        std::__cxx11::string::operator+=((string *)result,*local_20 + ' ');
        std::__cxx11::string::operator+=((string *)result,"]");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)result,"[");
      std::__cxx11::string::operator+=((string *)result,*local_20 + -0x20);
      std::__cxx11::string::operator+=((string *)result,*local_20);
      std::__cxx11::string::operator+=((string *)result,"]");
    }
  }
  return;
}

Assistant:

static void cmScriptGeneratorEncodeConfig(const std::string& config,
                                          std::string& result)
{
  for (const char* c = config.c_str(); *c; ++c) {
    if (*c >= 'a' && *c <= 'z') {
      result += "[";
      result += static_cast<char>(*c + 'A' - 'a');
      result += *c;
      result += "]";
    } else if (*c >= 'A' && *c <= 'Z') {
      result += "[";
      result += *c;
      result += static_cast<char>(*c + 'a' - 'A');
      result += "]";
    } else {
      result += *c;
    }
  }
}